

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O1

ThreadContext * __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::append
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  ThreadContext *this_00;
  PoolList<Future<void>::Private::ThreadPool::ThreadContext> *pPVar4;
  
  this_00 = allocateFreeItem(this);
  Thread::Thread(&this_00->_thread);
  this_00->_terminated = false;
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pIVar3 = pIVar1->prev;
  pIVar2->prev = pIVar3;
  pPVar4 = this;
  if (pIVar3 != (Item *)0x0) {
    pPVar4 = (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *)pIVar1->prev;
  }
  (pPVar4->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return this_00;
}

Assistant:

T& append() {return linkFreeItem(new (allocateFreeItem()) T);}